

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_mutex.hpp
# Opt level: O2

void __thiscall
oqpi::posix_mutex::posix_mutex
          (posix_mutex *this,string *name,sync_object_creation_options creationOption,
          bool lockOnCreation)

{
  posix_semaphore_wrapper pStack_38;
  
  (this->sem_).handle_ = (sem_t *)0x0;
  (this->sem_).name_._M_dataplus._M_p = (pointer)&(this->sem_).name_.field_2;
  (this->sem_).name_._M_string_length = 0;
  (this->sem_).name_.field_2._M_local_buf[0] = '\0';
  posix_semaphore_wrapper::posix_semaphore_wrapper
            (&pStack_38,name,creationOption,(uint)!lockOnCreation);
  posix_semaphore_wrapper::operator=(&this->sem_,&pStack_38);
  posix_semaphore_wrapper::~posix_semaphore_wrapper(&pStack_38);
  return;
}

Assistant:

posix_mutex(const std::string &name, sync_object_creation_options creationOption, bool lockOnCreation)
            : sem_()
        {
            // A mutex is simply a binary semaphore!
            const auto initCount    = lockOnCreation ? 0u : 1u;
            sem_                    = posix_semaphore_wrapper(name, creationOption, initCount);
        }